

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

void __thiscall
Catch::ResultBuilder::captureExpectedException(ResultBuilder *this,string *expectedMessage)

{
  Matcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_50
  ;
  CasedString local_40;
  
  if (expectedMessage->_M_string_length == 0) {
    local_50.super_SharedImpl<Catch::IShared>.m_rc = 0;
    local_50.super_SharedImpl<Catch::IShared>.super_IShared.super_NonCopyable._vptr_NonCopyable =
         (NonCopyable)&PTR__AllOf_00169550;
    local_40.m_caseSensitivity = Yes;
    local_40._4_4_ = 0;
    local_40.m_str._M_dataplus._M_p = (pointer)0x0;
    local_40.m_str._M_string_length = 0;
    captureExpectedException(this,&local_50);
    local_50.super_SharedImpl<Catch::IShared>.super_IShared.super_NonCopyable._vptr_NonCopyable =
         (NonCopyable)&PTR__AllOf_00169550;
    std::
    vector<Catch::Ptr<Catch::Matchers::Impl::Matcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<Catch::Ptr<Catch::Matchers::Impl::Matcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    ::~vector((vector<Catch::Ptr<Catch::Matchers::Impl::Matcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<Catch::Ptr<Catch::Matchers::Impl::Matcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
               *)&local_40);
  }
  else {
    local_50.super_SharedImpl<Catch::IShared>.m_rc = 0;
    local_50.super_SharedImpl<Catch::IShared>.super_IShared.super_NonCopyable._vptr_NonCopyable =
         (NonCopyable)&PTR__Equals_00167f30;
    local_40._0_8_ = local_40._0_8_ & 0xffffffff00000000;
    Matchers::Impl::StdString::CasedString::adjustString(&local_40.m_str,&local_40,expectedMessage);
    captureExpectedException(this,&local_50);
    local_50.super_SharedImpl<Catch::IShared>.super_IShared.super_NonCopyable._vptr_NonCopyable =
         (NonCopyable)&PTR__Equals_00167f30;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40.m_str._M_dataplus._M_p != &local_40.m_str.field_2) {
      operator_delete(local_40.m_str._M_dataplus._M_p);
    }
  }
  return;
}

Assistant:

void ResultBuilder::captureExpectedException( std::string const& expectedMessage ) {
        if( expectedMessage.empty() )
            captureExpectedException( Matchers::Impl::Generic::AllOf<std::string>() );
        else
            captureExpectedException( Matchers::Equals( expectedMessage ) );
    }